

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<unsigned_long>::addAll<unsigned_long*,true>
          (ArrayBuilder<unsigned_long> *this,unsigned_long *start,unsigned_long *end)

{
  unsigned_long *puVar1;
  unsigned_long *end_local;
  unsigned_long *start_local;
  ArrayBuilder<unsigned_long> *this_local;
  
  puVar1 = kj::_::CopyConstructArray_<unsigned_long,_unsigned_long_*,_true,_false>::apply
                     (this->pos,start,end);
  this->pos = puVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}